

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

uint8_t __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::GetNibble<absl::lts_20250127::uint128>
          (anon_unknown_0 *this,uint128 n,size_t nibble_index)

{
  int iVar1;
  uint128 uVar2;
  uint128 n_local;
  
  n_local.hi_ = n.lo_;
  iVar1 = ((uint)n.hi_ & 0x3f) << 2;
  n_local.lo_ = (uint64_t)this;
  uVar2 = (uint128)__ashlti3(0xf,0,iVar1);
  uint128::operator&=(&n_local,uVar2);
  uVar2 = (uint128)__lshrti3(n_local.lo_,n_local.hi_,iVar1);
  uVar2 = operator&(uVar2,(uint128)ZEXT816(0xf));
  return (uint8_t)uVar2.lo_;
}

Assistant:

uint8_t GetNibble(Int n, size_t nibble_index) {
  constexpr Int mask_low_nibble = Int{0xf};
  int shift = static_cast<int>(nibble_index * 4);
  n &= mask_low_nibble << shift;
  return static_cast<uint8_t>((n >> shift) & 0xf);
}